

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O0

bool __thiscall psy::C::Parser::parseAlignmentSpecifier_AtFirst(Parser *this,SpecifierSyntax **spec)

{
  SyntaxKind SVar1;
  SyntaxToken *this_00;
  ostream *poVar2;
  AlignmentSpecifierSyntax *pAVar3;
  IndexType IVar4;
  AlignmentSpecifierSyntax *alignSpec;
  SpecifierSyntax **spec_local;
  Parser *this_local;
  
  this_00 = peek(this,1);
  SVar1 = SyntaxToken::kind(this_00);
  if (SVar1 == KeywordAlias___alignas) {
    pAVar3 = makeNode<psy::C::AlignmentSpecifierSyntax>(this);
    *spec = &pAVar3->super_SpecifierSyntax;
    IVar4 = consume(this);
    pAVar3->alignasKwTkIdx_ = IVar4;
    this_local._7_1_ = parseParenthesizedTypeNameOrExpression(this,&pAVar3->tyRef_);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Declarations.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x596);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,"assert failure: `_Alignas\'");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::parseAlignmentSpecifier_AtFirst(SpecifierSyntax*& spec)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::Keyword__Alignas,
                  return false,
                  "assert failure: `_Alignas'");

    auto alignSpec = makeNode<AlignmentSpecifierSyntax>();
    spec = alignSpec;
    alignSpec->alignasKwTkIdx_ = consume();
    return parseParenthesizedTypeNameOrExpression(alignSpec->tyRef_);
}